

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O1

void Llb_ManMarkInternalPivots(Aig_Man_t *p)

{
  Aig_Obj_t *pPivot;
  ulong uVar1;
  int iVar2;
  Vec_Ptr_t *vMuxes;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  vMuxes = Aig_ManMuxesCollect(p);
  Aig_ManMuxesDeref(p,vMuxes);
  Aig_ManCleanMarkB(p);
  Llb_ManLabelLiCones(p);
  Aig_ManFanoutStart(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pPivot = (Aig_Obj_t *)pVVar3->pArray[lVar4];
      if (((pPivot != (Aig_Obj_t *)0x0) &&
          (uVar1 = *(ulong *)&pPivot->field_0x18, 0xfffffffd < ((uint)uVar1 & 7) - 7)) &&
         ((uVar1 & 0xffffff80) != 0 && (uVar1 & 0x20) != 0)) {
        iVar2 = Llb_ManTracePaths(p,pPivot);
        if (0 < iVar2) {
          pPivot->field_0x18 = pPivot->field_0x18 | 0x10;
        }
      }
      lVar4 = lVar4 + 1;
      pVVar3 = p->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkB(p);
  Aig_ManMuxesRef(p,vMuxes);
  if (vMuxes->pArray != (void **)0x0) {
    free(vMuxes->pArray);
    vMuxes->pArray = (void **)0x0;
  }
  if (vMuxes != (Vec_Ptr_t *)0x0) {
    free(vMuxes);
    return;
  }
  return;
}

Assistant:

void Llb_ManMarkInternalPivots( Aig_Man_t * p )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    // remove refs due to MUXes
    vMuxes = Aig_ManMuxesCollect( p );
    Aig_ManMuxesDeref( p, vMuxes );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );
    Llb_ManLabelLiCones( p );

    // mark internal nodes
    Aig_ManFanoutStart( p );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkB && pObj->nRefs > 1 )
        {
            if ( Llb_ManTracePaths(p, pObj) > 0 )
                pObj->fMarkA = 1;
            Counter++;
        }
    Aig_ManFanoutStop( p );
//    printf( "TracePath tried = %d.\n", Counter );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );

    // add refs due to MUXes
    Aig_ManMuxesRef( p, vMuxes );
    Vec_PtrFree( vMuxes );
}